

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::StartScheduledTasks
          (PeerManagerImpl *this,CScheduler *scheduler)

{
  Function f;
  Function f_00;
  uint64_t uVar1;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  _Manager_type in_stack_ffffffffffffff18;
  code *pcVar2;
  _Invoker_type in_stack_ffffffffffffff20;
  PeerManagerImpl *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  FastRandomContext local_b0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_d0 = 0;
  pcStack_c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2110:29)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2110:29)>
             ::_M_manager;
  f.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff10;
  f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff08;
  f.super__Function_base._M_manager = in_stack_ffffffffffffff18;
  f._M_invoker = in_stack_ffffffffffffff20;
  local_d8 = this;
  CScheduler::scheduleEvery(scheduler,f,(milliseconds)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  FastRandomContext::FastRandomContext(&local_b0,false);
  do {
    uVar1 = RandomMixin<FastRandomContext>::randbits
                      (&local_b0.super_RandomMixin<FastRandomContext>,0x13);
  } while (299999 < uVar1);
  ChaCha20::~ChaCha20(&local_b0.rng);
  pcVar2 = std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2114:31)>
           ::_M_manager;
  f_00.super__Function_base._M_functor._8_8_ = scheduler;
  f_00.super__Function_base._M_functor._M_unused._M_object = this;
  f_00.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2114:31)>
       ::_M_manager;
  f_00._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp:2114:31)>
       ::_M_invoke;
  CScheduler::scheduleFromNow(scheduler,f_00,(milliseconds)&stack0xffffffffffffff08);
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(&stack0xffffffffffffff08,&stack0xffffffffffffff08,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::StartScheduledTasks(CScheduler& scheduler)
{
    // Stale tip checking and peer eviction are on two different timers, but we
    // don't want them to get out of sync due to drift in the scheduler, so we
    // combine them in one function and schedule at the quicker (peer-eviction)
    // timer.
    static_assert(EXTRA_PEER_CHECK_INTERVAL < STALE_CHECK_INTERVAL, "peer eviction timer should be less than stale tip check timer");
    scheduler.scheduleEvery([this] { this->CheckForStaleTipAndEvictPeers(); }, std::chrono::seconds{EXTRA_PEER_CHECK_INTERVAL});

    // schedule next run for 10-15 minutes in the future
    const auto delta = 10min + FastRandomContext().randrange<std::chrono::milliseconds>(5min);
    scheduler.scheduleFromNow([&] { ReattemptInitialBroadcast(scheduler); }, delta);
}